

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_ALSADriver.cpp
# Opt level: O2

void ALSAMidiDriver::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    if ((*_a[1] == mainWindowTitleContributionUpdated) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    mainWindowTitleContributionUpdated((ALSAMidiDriver *)_o,(QString *)_a[1]);
    return;
  }
  return;
}

Assistant:

void ALSAMidiDriver::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ALSAMidiDriver *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->mainWindowTitleContributionUpdated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ALSAMidiDriver::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ALSAMidiDriver::mainWindowTitleContributionUpdated)) {
                *result = 0;
                return;
            }
        }
    }
}